

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.cpp
# Opt level: O1

void __thiscall
CHeap::updateheap_unsafe(CHeap *this,AbstractSearchState *AbstractSearchState,CKey *NewKey)

{
  int iVar1;
  heapelement *phVar2;
  long lVar3;
  
  if (AbstractSearchState->heapindex == 0) {
    heaperror("updateheap: AbstractSearchState is not in heap");
  }
  phVar2 = this->heap;
  iVar1 = AbstractSearchState->heapindex;
  lVar3 = NewKey->key[1];
  if ((phVar2[iVar1].key.key[0] == NewKey->key[0]) && (phVar2[iVar1].key.key[1] == lVar3)) {
    return;
  }
  phVar2[iVar1].key.key[0] = NewKey->key[0];
  phVar2[iVar1].key.key[1] = lVar3;
  return;
}

Assistant:

void CHeap::updateheap_unsafe(AbstractSearchState* AbstractSearchState, CKey NewKey)
{
    if (AbstractSearchState->heapindex == 0) {
        heaperror("updateheap: AbstractSearchState is not in heap");
    }
    if (heap[AbstractSearchState->heapindex].key != NewKey) {
        heap[AbstractSearchState->heapindex].key = NewKey;
    }
}